

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerouteRunner.cpp
# Opt level: O2

void __thiscall TracerouteRunner::fetch_results(TracerouteRunner *this)

{
  char *pcVar1;
  runtime_error *this_00;
  unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> pipe;
  array<char,_1024UL> *local_448;
  string cmd;
  array<char,_1024UL> buffer;
  
  memset(&buffer,0,0x400);
  std::operator+(&cmd,"traceroute ",&this->network_address);
  pipe._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (_IO_FILE *)popen(cmd._M_dataplus._M_p,"r");
  pipe._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
  super__Tuple_impl<1UL,_int_(*)(_IO_FILE_*)>.super__Head_base<1UL,_int_(*)(_IO_FILE_*),_false>.
  _M_head_impl = (_Head_base<1UL,_int_(*)(_IO_FILE_*),_false>)pclose;
  if ((FILE *)pipe._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
              super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
              super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl != (FILE *)0x0) {
    while( true ) {
      pcVar1 = fgets(buffer._M_elems,0x400,
                     (FILE *)pipe._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                             super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                             super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      if (pcVar1 == (char *)0x0) break;
      std::mutex::lock(&this->mutex_results);
      local_448 = &buffer;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                 (char **)&local_448);
      pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_results);
    }
    this->read_complete = true;
    std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::~unique_ptr(&pipe);
    std::__cxx11::string::~string((string *)&cmd);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"popen() failed!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TracerouteRunner::fetch_results() {
	std::array<char, 1024> buffer {};
	const std::string cmd = "traceroute " + this->network_address;

	std::unique_ptr<FILE, decltype(&pclose)> pipe(popen(cmd.c_str(), "r"), pclose);
	if (!pipe) {
		throw std::runtime_error("popen() failed!");
	}

	while (fgets(buffer.data(), buffer.size(), pipe.get()) != nullptr) {
		this->mutex_results.lock();
		this->results.emplace_back(buffer.data());
		this->mutex_results.unlock();
	}

	this->read_complete = true;
}